

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_manager.cc
# Opt level: O0

RC __thiscall QL_Manager::SetUpOneRelation(QL_Manager *this,char *relName)

{
  RelCatEntry *pRVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_bool>
  pVar8;
  int local_ec;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_e8;
  _Base_ptr local_c0;
  undefined1 local_b8;
  int local_ac;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_a8;
  allocator local_79;
  undefined1 local_78 [8];
  string relString;
  undefined1 local_48 [8];
  RM_Record relRec;
  RelCatEntry *rEntry;
  RC rc;
  char *relName_local;
  QL_Manager *this_local;
  
  RM_Record::RM_Record((RM_Record *)local_48);
  this_local._4_4_ =
       SM_Manager::GetRelEntry(this->smm,relName,(RM_Record *)local_48,(RelCatEntry **)&relRec.size)
  ;
  if (this_local._4_4_ == 0) {
    pRVar1 = this->relEntries;
    *(undefined4 *)&pRVar1->statsInitialized = *(undefined4 *)(relRec._16_8_ + 0x30);
    uVar2 = *(undefined8 *)relRec._16_8_;
    uVar3 = *(undefined8 *)(relRec._16_8_ + 8);
    uVar4 = *(undefined8 *)(relRec._16_8_ + 0x10);
    uVar5 = *(undefined8 *)(relRec._16_8_ + 0x18);
    uVar6 = *(undefined8 *)(relRec._16_8_ + 0x20);
    uVar7 = *(undefined8 *)(relRec._16_8_ + 0x28);
    pRVar1->attrCount = (int)uVar6;
    pRVar1->indexCount = (int)((ulong)uVar6 >> 0x20);
    pRVar1->indexCurrNum = (int)uVar7;
    pRVar1->numTuples = (int)((ulong)uVar7 >> 0x20);
    *(undefined8 *)(pRVar1->relName + 0x10) = uVar4;
    *(undefined8 *)(pRVar1->relName + 0x18) = uVar5;
    *(undefined8 *)pRVar1->relName = uVar2;
    *(undefined8 *)(pRVar1->relName + 8) = uVar3;
    this->nRels = 1;
    this->nAttrs = *(int *)(relRec._16_8_ + 0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_78,relName,&local_79);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    local_ac = 0;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_true>
              (&local_a8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
               &local_ac);
    pVar8 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ::insert(&this->relToInt,&local_a8);
    local_c0 = (_Base_ptr)pVar8.first._M_node;
    local_b8 = pVar8.second;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
    ::~pair(&local_a8);
    local_ec = 0;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_true>
              (&local_e8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
               &local_ec);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ::insert(&this->relToAttrIndex,&local_e8);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
    ::~pair(&local_e8);
    this_local._4_4_ = 0;
    relString.field_2._8_4_ = 1;
    std::__cxx11::string::~string((string *)local_78);
  }
  else {
    relString.field_2._8_4_ = 1;
  }
  RM_Record::~RM_Record((RM_Record *)local_48);
  return this_local._4_4_;
}

Assistant:

RC QL_Manager::SetUpOneRelation(const char *relName){
  RC rc = 0;
  RelCatEntry *rEntry;
  RM_Record relRec;
  if((rc = smm.GetRelEntry(relName, relRec, rEntry))){
    return (rc);
  }
  memcpy(relEntries, rEntry, sizeof(RelCatEntry));

  nRels = 1;
  nAttrs = rEntry->attrCount;
  string relString(relName);
  relToInt.insert({relString, 0});
  relToAttrIndex.insert({relString, 0});
  return (0);
}